

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_file_writer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  element_type *peVar1;
  ostream *poVar2;
  Writer *__p;
  istream *piVar3;
  shared_ptr<diffusion::Writer> file_writer;
  string current_line;
  string dfsn_file;
  _Vector_base<char,_std::allocator<char>_> local_240;
  ifstream input_text_file;
  
  if (argc < 3) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Usage: ");
    poVar2 = std::operator<<(poVar2,*argv);
    poVar2 = std::operator<<(poVar2," diffusion_file input_text_file");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    std::ifstream::ifstream(&input_text_file,argv[2],_S_in);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&dfsn_file,argv[1],(allocator<char> *)&current_line);
    __p = diffusion::create_file_writer(&dfsn_file);
    std::__shared_ptr<diffusion::Writer,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<diffusion::Writer,void>
              ((__shared_ptr<diffusion::Writer,(__gnu_cxx::_Lock_policy)2> *)&file_writer,__p);
    current_line._M_dataplus._M_p = (pointer)&current_line.field_2;
    current_line._M_string_length = 0;
    current_line.field_2._M_local_buf[0] = '\0';
    while( true ) {
      piVar3 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&input_text_file,(string *)&current_line);
      peVar1 = file_writer.super___shared_ptr<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (((byte)piVar3[*(long *)(*(long *)piVar3 + -0x18) + 0x20] & 5) != 0) break;
      diffusion::to_vector_char
                ((vector<char,_std::allocator<char>_> *)&local_240,current_line._M_dataplus._M_p,
                 current_line._M_string_length);
      (**peVar1->_vptr_Writer)(peVar1,&local_240);
      std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_240);
    }
    std::__cxx11::string::~string((string *)&current_line);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&file_writer.super___shared_ptr<diffusion::Writer,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&dfsn_file);
    std::ifstream::~ifstream(&input_text_file);
  }
  return 0;
}

Assistant:

int main(int argc, char * argv[]) {
    if (argc < 3) {
        std::cerr << "Usage: " << argv[0] << " diffusion_file input_text_file" << std::endl;
        return 0;
    }
    std::ifstream input_text_file(argv[2]);
    std::string dfsn_file = argv[1];
    auto file_writer = std::shared_ptr<diffusion::Writer>(diffusion::create_file_writer(dfsn_file));
    std::string current_line;
    while (std::getline(input_text_file, current_line)) {
        file_writer->write(diffusion::to_vector_char(current_line.c_str(), current_line.length()));
    }
    return 0;
}